

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

DisconnectResult __thiscall
Chainstate::DisconnectBlock
          (Chainstate *this,CBlock *block,CBlockIndex *pindex,CCoinsViewCache *view)

{
  long lVar1;
  ConstevalFormatString<0U> fmt;
  ConstevalFormatString<0U> fmt_00;
  ConstevalFormatString<0U> fmt_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  bool bVar2;
  byte bVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  element_type *peVar7;
  CCoinsViewCache *pCVar8;
  long in_RDX;
  LogFlags in_RDI;
  long in_FS_OFFSET;
  int res;
  COutPoint *out_1;
  uint j;
  CTxUndo *txundo;
  bool is_spent;
  size_t o;
  bool is_bip30_exception;
  bool is_coinbase;
  CTransaction *tx;
  int i;
  bool fEnforceBIP30;
  bool fClean;
  CBlockUndo blockUndo;
  Coin coin;
  COutPoint out;
  Txid hash;
  undefined4 in_stack_fffffffffffffd48;
  uint32_t in_stack_fffffffffffffd4c;
  CTxOut *in_stack_fffffffffffffd50;
  CBlockIndex *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  CCoinsViewCache *in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd70;
  uint uVar9;
  int in_stack_fffffffffffffd74;
  CCoinsViewCache *in_stack_fffffffffffffd78;
  byte local_26a;
  bool local_25b;
  bool local_25a;
  undefined1 *puVar10;
  CBlockIndex *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  BlockManager *in_stack_fffffffffffffdd8;
  ulong local_210;
  undefined6 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdfe;
  undefined1 in_stack_fffffffffffffdff;
  undefined8 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  int iVar11;
  undefined4 in_stack_fffffffffffffe0c;
  uint uVar12;
  undefined8 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  char local_1c1;
  DisconnectResult local_19c;
  undefined1 local_138 [40];
  Level in_stack_fffffffffffffef0;
  uint local_d8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd4c,(AnnotatedMixin<std::recursive_mutex> *)0x148d928);
  local_1c1 = '\x01';
  puVar10 = local_138;
  CBlockUndo::CBlockUndo
            ((CBlockUndo *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  bVar2 = ::node::BlockManager::UndoReadFromDisk
                    (in_stack_fffffffffffffdd8,
                     (CBlockUndo *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     in_stack_fffffffffffffdc8);
  iVar11 = (int)((ulong)puVar10 >> 0x20);
  if (!bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd68,
               (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd68,
               (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    in_stack_fffffffffffffd48 = 4;
    logging_function._M_str._0_4_ = in_stack_fffffffffffffe18;
    logging_function._M_len = in_stack_fffffffffffffe10;
    logging_function._M_str._4_4_ = in_stack_fffffffffffffe1c;
    source_file._M_str._0_4_ = in_stack_fffffffffffffe08;
    source_file._M_len = in_stack_fffffffffffffe00;
    source_file._M_str._4_4_ = in_stack_fffffffffffffe0c;
    fmt.fmt._6_1_ = in_stack_fffffffffffffdfe;
    fmt.fmt._0_6_ = in_stack_fffffffffffffdf8;
    fmt.fmt._7_1_ = in_stack_fffffffffffffdff;
    LogPrintFormatInternal<>
              (logging_function,source_file,iVar11,in_RDI,in_stack_fffffffffffffef0,fmt);
    local_19c = DISCONNECT_FAILED;
    goto LAB_0148e294;
  }
  sVar5 = std::vector<CTxUndo,_std::allocator<CTxUndo>_>::size
                    ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)
                     CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  sVar6 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  iVar11 = (int)((ulong)puVar10 >> 0x20);
  if (sVar5 + 1 != sVar6) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd68,
               (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd68,
               (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    in_stack_fffffffffffffd48 = 4;
    logging_function_00._M_str._0_4_ = in_stack_fffffffffffffe18;
    logging_function_00._M_len = (size_t)"DisconnectBlock(): block and undo data inconsistent\n";
    logging_function_00._M_str._4_4_ = in_stack_fffffffffffffe1c;
    source_file_00._M_str._0_4_ = in_stack_fffffffffffffe08;
    source_file_00._M_len = in_stack_fffffffffffffe00;
    source_file_00._M_str._4_4_ = in_stack_fffffffffffffe0c;
    fmt_00.fmt._6_1_ = in_stack_fffffffffffffdfe;
    fmt_00.fmt._0_6_ = in_stack_fffffffffffffdf8;
    fmt_00.fmt._7_1_ = in_stack_fffffffffffffdff;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,iVar11,in_RDI,in_stack_fffffffffffffef0,fmt_00);
    local_19c = DISCONNECT_FAILED;
    goto LAB_0148e294;
  }
  if (*(int *)(in_RDX + 0x18) == 0x1664a) {
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffd58);
    bVar2 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffd58,
                         (base_blob<256U> *)in_stack_fffffffffffffd50);
    local_25a = true;
    if (!bVar2) goto LAB_0148dc58;
  }
  else {
LAB_0148dc58:
    local_25b = false;
    if (*(int *)(in_RDX + 0x18) == 0x166a4) {
      CBlockIndex::GetBlockHash(in_stack_fffffffffffffd58);
      local_25b = ::operator==((base_blob<256U> *)in_stack_fffffffffffffd58,
                               (base_blob<256U> *)in_stack_fffffffffffffd50);
    }
    local_25a = local_25b;
  }
  uVar12 = (CONCAT13(local_25a,(int3)in_stack_fffffffffffffe0c) ^ 0xff000000) & 0x1ffffff;
  sVar5 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  iVar11 = (int)sVar5;
  while (iVar11 = iVar11 + -1, -1 < iVar11) {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffd58,(size_type)in_stack_fffffffffffffd50);
    peVar7 = std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)in_stack_fffffffffffffd58);
    CTransaction::GetHash
              ((CTransaction *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    bVar3 = CTransaction::IsCoinBase((CTransaction *)in_stack_fffffffffffffd58);
    local_26a = 0;
    if ((bool)bVar3) {
      local_26a = (byte)(uVar12 >> 0x18) ^ 0xff;
    }
    local_26a = local_26a & 1;
    for (local_210 = 0;
        sVar5 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                          ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                           CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)),
        local_210 < sVar5; local_210 = local_210 + 1) {
      std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffd58,
                 (size_type)in_stack_fffffffffffffd50);
      bVar2 = CScript::IsUnspendable((CScript *)in_stack_fffffffffffffd50);
      if (!bVar2) {
        COutPoint::COutPoint
                  ((COutPoint *)in_stack_fffffffffffffd58,(Txid *)in_stack_fffffffffffffd50,
                   in_stack_fffffffffffffd4c);
        Coin::Coin((Coin *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        bVar2 = CCoinsViewCache::SpendCoin
                          (in_stack_fffffffffffffd78,
                           (COutPoint *)
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           (Coin *)in_stack_fffffffffffffd68);
        if (bVar2) {
          std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffd58,
                     (size_type)in_stack_fffffffffffffd50);
          bVar2 = ::operator!=((CTxOut *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
          if (((bVar2) || (*(uint *)(in_RDX + 0x18) != local_d8 >> 1)) ||
             ((uint)(bVar3 & 1) != (local_d8 & 1))) goto LAB_0148dfd9;
        }
        else {
LAB_0148dfd9:
          if ((local_26a & 1) == 0) {
            local_1c1 = '\0';
          }
        }
        Coin::~Coin((Coin *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      }
    }
    if (0 < iVar11) {
      std::vector<CTxUndo,_std::allocator<CTxUndo>_>::operator[]
                ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)in_stack_fffffffffffffd58,
                 (size_type)in_stack_fffffffffffffd50);
      in_stack_fffffffffffffd78 =
           (CCoinsViewCache *)
           std::vector<Coin,_std::allocator<Coin>_>::size
                     ((vector<Coin,_std::allocator<Coin>_> *)
                      CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      pCVar8 = (CCoinsViewCache *)
               std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                         ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                          CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      iVar4 = (int)((ulong)puVar10 >> 0x20);
      if (in_stack_fffffffffffffd78 != pCVar8) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd68,
                   (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd68,
                   (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        in_stack_fffffffffffffd48 = 4;
        logging_function_01._M_str._0_4_ = in_stack_fffffffffffffe18;
        logging_function_01._M_len = in_stack_fffffffffffffe10;
        logging_function_01._M_str._4_4_ = in_stack_fffffffffffffe1c;
        source_file_01._M_str._0_4_ = iVar11;
        source_file_01._M_len = (size_t)peVar7;
        source_file_01._M_str._4_4_ = uVar12;
        fmt_01.fmt._6_1_ = local_26a;
        fmt_01.fmt._0_6_ = in_stack_fffffffffffffdf8;
        fmt_01.fmt._7_1_ = bVar3;
        LogPrintFormatInternal<>
                  (logging_function_01,source_file_01,iVar4,in_RDI,in_stack_fffffffffffffef0,fmt_01)
        ;
        local_19c = DISCONNECT_FAILED;
        goto LAB_0148e294;
      }
      sVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                        ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                         CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      iVar4 = (int)sVar5;
      while (iVar4 != 0) {
        iVar4 = iVar4 + -1;
        std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                  ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffd58,
                   (size_type)in_stack_fffffffffffffd50);
        std::vector<Coin,_std::allocator<Coin>_>::operator[]
                  ((vector<Coin,_std::allocator<Coin>_> *)in_stack_fffffffffffffd58,
                   (size_type)in_stack_fffffffffffffd50);
        in_stack_fffffffffffffd74 =
             ApplyTxInUndo((Coin *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           in_stack_fffffffffffffd68,
                           (COutPoint *)
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        if (in_stack_fffffffffffffd74 == 2) {
          local_19c = DISCONNECT_FAILED;
          goto LAB_0148e294;
        }
        uVar9 = in_stack_fffffffffffffd70 & 0xffffff;
        if (local_1c1 != '\0') {
          uVar9 = CONCAT13(in_stack_fffffffffffffd74 != 1,(int3)in_stack_fffffffffffffd70);
        }
        local_1c1 = (char)(uVar9 >> 0x18);
        in_stack_fffffffffffffd70 = uVar9;
      }
    }
  }
  CBlockIndex::GetBlockHash(in_stack_fffffffffffffd58);
  CCoinsViewCache::SetBestBlock
            ((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
             (uint256 *)0x148e26c);
  local_19c = (DisconnectResult)(local_1c1 == '\0');
LAB_0148e294:
  CBlockUndo::~CBlockUndo
            ((CBlockUndo *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19c;
  }
  __stack_chk_fail();
}

Assistant:

DisconnectResult Chainstate::DisconnectBlock(const CBlock& block, const CBlockIndex* pindex, CCoinsViewCache& view)
{
    AssertLockHeld(::cs_main);
    bool fClean = true;

    CBlockUndo blockUndo;
    if (!m_blockman.UndoReadFromDisk(blockUndo, *pindex)) {
        LogError("DisconnectBlock(): failure reading undo data\n");
        return DISCONNECT_FAILED;
    }

    if (blockUndo.vtxundo.size() + 1 != block.vtx.size()) {
        LogError("DisconnectBlock(): block and undo data inconsistent\n");
        return DISCONNECT_FAILED;
    }

    // Ignore blocks that contain transactions which are 'overwritten' by later transactions,
    // unless those are already completely spent.
    // See https://github.com/bitcoin/bitcoin/issues/22596 for additional information.
    // Note: the blocks specified here are different than the ones used in ConnectBlock because DisconnectBlock
    // unwinds the blocks in reverse. As a result, the inconsistency is not discovered until the earlier
    // blocks with the duplicate coinbase transactions are disconnected.
    bool fEnforceBIP30 = !((pindex->nHeight==91722 && pindex->GetBlockHash() == uint256{"00000000000271a2dc26e7667f8419f2e15416dc6955e5a6c6cdf3f2574dd08e"}) ||
                           (pindex->nHeight==91812 && pindex->GetBlockHash() == uint256{"00000000000af0aed4792b1acee3d966af36cf5def14935db8de83d6f9306f2f"}));

    // undo transactions in reverse order
    for (int i = block.vtx.size() - 1; i >= 0; i--) {
        const CTransaction &tx = *(block.vtx[i]);
        Txid hash = tx.GetHash();
        bool is_coinbase = tx.IsCoinBase();
        bool is_bip30_exception = (is_coinbase && !fEnforceBIP30);

        // Check that all outputs are available and match the outputs in the block itself
        // exactly.
        for (size_t o = 0; o < tx.vout.size(); o++) {
            if (!tx.vout[o].scriptPubKey.IsUnspendable()) {
                COutPoint out(hash, o);
                Coin coin;
                bool is_spent = view.SpendCoin(out, &coin);
                if (!is_spent || tx.vout[o] != coin.out || pindex->nHeight != coin.nHeight || is_coinbase != coin.fCoinBase) {
                    if (!is_bip30_exception) {
                        fClean = false; // transaction output mismatch
                    }
                }
            }
        }

        // restore inputs
        if (i > 0) { // not coinbases
            CTxUndo &txundo = blockUndo.vtxundo[i-1];
            if (txundo.vprevout.size() != tx.vin.size()) {
                LogError("DisconnectBlock(): transaction and undo data inconsistent\n");
                return DISCONNECT_FAILED;
            }
            for (unsigned int j = tx.vin.size(); j > 0;) {
                --j;
                const COutPoint& out = tx.vin[j].prevout;
                int res = ApplyTxInUndo(std::move(txundo.vprevout[j]), view, out);
                if (res == DISCONNECT_FAILED) return DISCONNECT_FAILED;
                fClean = fClean && res != DISCONNECT_UNCLEAN;
            }
            // At this point, all of txundo.vprevout should have been moved out.
        }
    }

    // move best block pointer to prevout block
    view.SetBestBlock(pindex->pprev->GetBlockHash());

    return fClean ? DISCONNECT_OK : DISCONNECT_UNCLEAN;
}